

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_common.c
# Opt level: O2

void av1_set_vert_loop_filter_done
               (AV1_COMMON *cm,AV1LfSync *lf_sync,int num_mis_in_lpf_unit_height_log2)

{
  byte bVar1;
  int sb_cols;
  int plane;
  uint uVar2;
  int iVar3;
  int r;
  
  bVar1 = (byte)num_mis_in_lpf_unit_height_log2;
  uVar2 = ~(-1 << (bVar1 & 0x1f));
  sb_cols = (int)((cm->mi_params).mi_cols + uVar2) >> (bVar1 & 0x1f);
  iVar3 = (int)(uVar2 + (cm->mi_params).mi_rows) >> (bVar1 & 0x1f);
  r = 0;
  if (iVar3 < 1) {
    iVar3 = r;
  }
  for (; r != iVar3; r = r + 1) {
    for (plane = 0; plane != 3; plane = plane + 1) {
      sync_write(lf_sync,r,sb_cols + -1,sb_cols,plane);
    }
  }
  return;
}

Assistant:

void av1_set_vert_loop_filter_done(AV1_COMMON *cm, AV1LfSync *lf_sync,
                                   int num_mis_in_lpf_unit_height_log2) {
  int plane, sb_row;
  const int sb_cols =
      CEIL_POWER_OF_TWO(cm->mi_params.mi_cols, num_mis_in_lpf_unit_height_log2);
  const int sb_rows =
      CEIL_POWER_OF_TWO(cm->mi_params.mi_rows, num_mis_in_lpf_unit_height_log2);

  // In case of loopfilter row-multithreading, the worker on an SB row waits for
  // the vertical edge filtering of the right and top-right SBs. Hence, in case
  // a thread (main/worker) encounters an error, update that vertical
  // loopfiltering of every SB row in the frame is complete in order to avoid
  // dependent workers waiting indefinitely.
  for (sb_row = 0; sb_row < sb_rows; ++sb_row)
    for (plane = 0; plane < MAX_MB_PLANE; ++plane)
      sync_write(lf_sync, sb_row, sb_cols - 1, sb_cols, plane);
}